

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::InternalSwap
          (BiDirectionalLSTMLayerParams *this,BiDirectionalLSTMLayerParams *other)

{
  BiDirectionalLSTMLayerParams *other_local;
  BiDirectionalLSTMLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::InternalSwap
            (&this->activationsforwardlstm_,&other->activationsforwardlstm_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::InternalSwap
            (&this->activationsbackwardlstm_,&other->activationsbackwardlstm_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::InternalSwap
            (&this->weightparams_,&other->weightparams_);
  google::protobuf::internal::memswap<24>((char *)&this->params_,(char *)&other->params_);
  return;
}

Assistant:

void BiDirectionalLSTMLayerParams::InternalSwap(BiDirectionalLSTMLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  activationsforwardlstm_.InternalSwap(&other->activationsforwardlstm_);
  activationsbackwardlstm_.InternalSwap(&other->activationsbackwardlstm_);
  weightparams_.InternalSwap(&other->weightparams_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(BiDirectionalLSTMLayerParams, outputvectorsize_)
      + sizeof(BiDirectionalLSTMLayerParams::outputvectorsize_)
      - PROTOBUF_FIELD_OFFSET(BiDirectionalLSTMLayerParams, params_)>(
          reinterpret_cast<char*>(&params_),
          reinterpret_cast<char*>(&other->params_));
}